

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall GraphTestDependencyCycle::~GraphTestDependencyCycle(GraphTestDependencyCycle *this)

{
  GraphTestDependencyCycle *this_local;
  
  ~GraphTestDependencyCycle(this);
  operator_delete(this,0x230);
  return;
}

Assistant:

TEST_F(GraphTest, DependencyCycle) {
  AssertParse(&state_,
"build out: cat mid\n"
"build mid: cat in\n"
"build in: cat pre\n"
"build pre: cat out\n");

  string err;
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("out"), NULL, &err));
  ASSERT_EQ("dependency cycle: out -> mid -> in -> pre -> out", err);
}